

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVArhsQ(sunrealtype t,N_Vector yB,N_Vector qBdot,void *cvode_mem)

{
  long lVar1;
  long lVar2;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  int retval;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  undefined4 local_3c;
  
  lVar1 = *(long *)(in_RDX + 0xa70);
  lVar2 = *(long *)(lVar1 + 0x40);
  if (*(int *)(lVar1 + 0xbc) == 0) {
    (**(code **)(lVar1 + 0xa8))(in_XMM0_Qa,in_RDX,*(undefined8 *)(lVar1 + 0x1f8),0);
  }
  else {
    (**(code **)(lVar1 + 0xa8))
              (in_XMM0_Qa,in_RDX,*(undefined8 *)(lVar1 + 0x1f8),*(undefined8 *)(lVar1 + 0x200));
  }
  if (*(int *)(lVar2 + 0x1c) == 0) {
    local_3c = (**(code **)(lVar2 + 0x30))
                         (in_XMM0_Qa,*(undefined8 *)(lVar1 + 0x1f8),in_RDI,in_RSI,
                          *(undefined8 *)(lVar2 + 0x40));
  }
  else {
    local_3c = (**(code **)(lVar2 + 0x38))
                         (in_XMM0_Qa,*(undefined8 *)(lVar1 + 0x1f8),*(undefined8 *)(lVar1 + 0x200),
                          in_RDI,in_RSI,*(undefined8 *)(lVar2 + 0x40));
  }
  return local_3c;
}

Assistant:

static int CVArhsQ(sunrealtype t, N_Vector yB, N_Vector qBdot, void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  /* int flag; */
  int retval;

  cv_mem = (CVodeMem)cvode_mem;

  ca_mem = cv_mem->cv_adj_mem;

  cvB_mem = ca_mem->ca_bckpbCrt;

  /* Get forward solution from interpolation */

  if (ca_mem->ca_IMinterpSensi)
  {
    /* flag = */ ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, ca_mem->ca_yStmp);
  }
  else
  { /* flag = */
    ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  }

  /* Call the user's RHS function */

  if (cvB_mem->cv_fQ_withSensi)
  {
    retval = (cvB_mem->cv_fQs)(t, ca_mem->ca_ytmp, ca_mem->ca_yStmp, yB, qBdot,
                               cvB_mem->cv_user_data);
  }
  else
  {
    retval = (cvB_mem->cv_fQ)(t, ca_mem->ca_ytmp, yB, qBdot,
                              cvB_mem->cv_user_data);
  }

  return (retval);
}